

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

int re2::Fanout(Prog *prog,
               map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *histogram
               )

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  _Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false> _Var4;
  int local_54;
  SparseArray<int> fanout;
  
  SparseArray<int>::SparseArray(&fanout,prog->size_);
  Prog::Fanout(prog,&fanout);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)histogram);
  for (_Var4 = fanout.dense_.ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>;
      _Var4._M_head_impl !=
      fanout.dense_.ptr_._M_t.
      super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
      .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl + fanout.size_
      ; _Var4._M_head_impl = _Var4._M_head_impl + 1) {
    local_54 = -1;
    do {
      local_54 = local_54 + 1;
    } while (1 << ((byte)local_54 & 0x1f) < (_Var4._M_head_impl)->value_);
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](histogram,&local_54);
    *pmVar2 = *pmVar2 + 1;
  }
  lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(histogram + 8));
  iVar1 = *(int *)(lVar3 + 0x20);
  SparseArray<int>::~SparseArray(&fanout);
  return iVar1;
}

Assistant:

static int Fanout(Prog* prog, std::map<int, int>* histogram) {
  SparseArray<int> fanout(prog->size());
  prog->Fanout(&fanout);
  histogram->clear();
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    // TODO(junyer): Optimise this?
    int bucket = 0;
    while (1 << bucket < i->value()) {
      bucket++;
    }
    (*histogram)[bucket]++;
  }
  return histogram->rbegin()->first;
}